

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigTransform.cpp
# Opt level: O0

void __thiscall
xmrig::ConfigTransform::transformBoolean(ConfigTransform *this,Document *doc,int key,bool enable)

{
  int in_EDX;
  bool unaff_retaddr;
  char *in_stack_00000008;
  undefined3 in_stack_00000010;
  
  if (in_EDX == 0x3f1) {
    BaseTransform::set<bool>
              (&this->super_BaseTransform,doc,(char *)CONCAT44(key,_in_stack_00000010),
               in_stack_00000008,unaff_retaddr);
  }
  else if (in_EDX == 0x400) {
    BaseTransform::set<bool>
              (&this->super_BaseTransform,doc,(char *)CONCAT44(key,_in_stack_00000010),
               in_stack_00000008,unaff_retaddr);
  }
  return;
}

Assistant:

void xmrig::ConfigTransform::transformBoolean(rapidjson::Document &doc, int key, bool enable)
{
    switch (key) {
    case IConfig::HugePagesKey: /* --no-huge-pages */
        return set(doc, kCpu, "huge-pages", enable);

    case IConfig::CPUKey:       /* --no-cpu */
        return set(doc, kCpu, kEnabled, enable);

    default:
        break;
    }
}